

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_cmpm(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  int opsize_00;
  TCGv_i32 src_00;
  TCGv_i32 dest;
  TCGv_i32 dst;
  TCGv_i32 src;
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  pTVar1 = s->uc->tcg_ctx;
  opsize_00 = insn_opsize((uint)insn);
  src_00 = gen_ea_mode(env,s,3,insn & 7,opsize_00,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                       (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  dest = gen_ea_mode(env,s,3,(int)(uint)insn >> 9 & 7,opsize_00,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,
                     EA_LOADS,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  gen_update_cc_cmp(s,dest,src_00,opsize_00);
  return;
}

Assistant:

DISAS_INSN(cmpm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize = insn_opsize(insn);
    TCGv src, dst;

    /* Post-increment load (mode 3) from Ay.  */
    src = gen_ea_mode(env, s, 3, REG(insn, 0), opsize,
                      tcg_ctx->NULL_QREG, NULL, EA_LOADS, IS_USER(s));
    /* Post-increment load (mode 3) from Ax.  */
    dst = gen_ea_mode(env, s, 3, REG(insn, 9), opsize,
                      tcg_ctx->NULL_QREG, NULL, EA_LOADS, IS_USER(s));

    gen_update_cc_cmp(s, dst, src, opsize);
}